

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::recursive_manipulation
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_manipulation_wrapper<viennamath::rt_expression_interface<double>_> *fw)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  rt_manipulation_wrapper<viennamath::rt_expression_interface<double>_> *fw_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  bVar1 = rt_manipulation_wrapper<viennamath::rt_expression_interface<double>_>::modifies
                    (fw,&this->super_rt_expression_interface<double>);
  if (bVar1) {
    this_local = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                 rt_manipulation_wrapper<viennamath::rt_expression_interface<double>_>::operator()
                           (fw,&this->super_rt_expression_interface<double>);
  }
  else {
    this_local = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
    peVar5 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->lhs_);
    iVar2 = (*peVar5->_vptr_rt_expression_interface[0xc])(peVar5,fw);
    peVar6 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>
             ::operator->(&this->op_);
    iVar3 = (*peVar6->_vptr_op_interface[2])();
    peVar5 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->rhs_);
    iVar4 = (*peVar5->_vptr_rt_expression_interface[0xc])(peVar5,fw);
    rt_binary_expr(this_local,(rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2),
                   (op_interface_type *)CONCAT44(extraout_var_00,iVar3),
                   (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar4));
  }
  return &this_local->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * recursive_manipulation(rt_manipulation_wrapper<InterfaceType> const & fw) const
      {
        if (fw.modifies(this))
          return fw(this);

        return new rt_binary_expr(lhs_->recursive_manipulation(fw),
                               op_->clone(),
                               rhs_->recursive_manipulation(fw) );
      }